

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O1

OPJ_BOOL opj_t1_decode_cblks(opj_t1_t *t1,opj_tcd_tilecomp_t *tilec,opj_tccp_t *tccp)

{
  long lVar1;
  byte *pbVar2;
  OPJ_UINT32 OVar3;
  uint uVar4;
  opj_tcd_resolution_t *poVar5;
  opj_tcd_precinct_t *poVar6;
  opj_tcd_cblk_enc_t *poVar7;
  opj_mqc_t *mqc;
  opj_raw_t *raw;
  opj_tcd_layer_t *poVar8;
  long *plVar9;
  opj_mqc_t *poVar10;
  opj_mqc_t *poVar11;
  opj_raw_t *raw_00;
  bool bVar12;
  uint uVar13;
  uint uVar14;
  OPJ_BOOL OVar15;
  uint uVar16;
  OPJ_INT32 OVar17;
  OPJ_UINT32 OVar18;
  int iVar19;
  ulong uVar20;
  OPJ_INT32 *pOVar21;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ushort uVar29;
  int iVar30;
  uint uVar31;
  int iVar32;
  OPJ_INT32 *pOVar33;
  uint uVar34;
  ushort *puVar35;
  uint uVar36;
  uint uVar37;
  int *piVar38;
  ushort uVar39;
  OPJ_BYTE *bp;
  ulong uVar40;
  uint uVar41;
  int iVar42;
  long lVar43;
  long lVar44;
  opj_tcd_band_t *poVar45;
  ulong uVar46;
  OPJ_UINT32 OVar47;
  uint uVar48;
  ulong uVar49;
  uint *puVar50;
  opj_flag_t *poVar51;
  ulong uVar52;
  byte bVar53;
  uint uVar54;
  ulong uVar55;
  bool bVar56;
  bool bVar57;
  bool bVar58;
  bool bVar59;
  OPJ_INT32 *local_168;
  opj_flag_t *local_160;
  OPJ_INT32 *local_150;
  ulong local_148;
  uint local_140;
  OPJ_INT32 *local_130;
  uint local_124;
  uint local_100;
  uint local_f8;
  uint local_e8;
  uint local_d4;
  
  if (tilec->minimum_num_resolutions != 0) {
    uVar13 = tilec->x1 - tilec->x0;
    uVar28 = 0;
    do {
      poVar5 = tilec->resolutions;
      if (poVar5[uVar28].numbands != 0) {
        uVar14 = (int)uVar28 - 1;
        uVar40 = 0;
        do {
          if (poVar5[uVar28].ph * poVar5[uVar28].pw != 0) {
            poVar45 = poVar5[uVar28].bands + uVar40;
            uVar27 = 0;
            do {
              poVar6 = poVar45->precincts;
              if (poVar6[uVar27].ch * poVar6[uVar27].cw != 0) {
                uVar52 = 0;
                do {
                  poVar7 = poVar6[uVar27].cblks.enc;
                  OVar3 = poVar45->bandno;
                  iVar42 = tccp->roishift;
                  uVar4 = tccp->cblksty;
                  mqc = t1->mqc;
                  raw = t1->raw;
                  OVar15 = opj_t1_allocate_buffers
                                     (t1,poVar7[uVar52].x0 - *(int *)&poVar7[uVar52].passes,
                                      poVar7[uVar52].y0 - *(int *)((long)&poVar7[uVar52].passes + 4)
                                     );
                  if (OVar15 == 0) {
                    return 0;
                  }
                  iVar19 = poVar7[uVar52].x1;
                  opj_mqc_resetstates(mqc);
                  opj_mqc_setstate(mqc,0x12,0,0x2e);
                  opj_mqc_setstate(mqc,0x11,0,3);
                  opj_mqc_setstate(mqc,0,0,4);
                  if (poVar7[uVar52].numpassesinlayers != 0) {
                    local_124 = iVar19 + iVar42;
                    uVar16 = OVar3 << 8;
                    local_100 = 2;
                    uVar26 = 0;
                    do {
                      bVar58 = (uVar4 & 1) == 0;
                      poVar8 = poVar7[uVar52].layers;
                      bVar12 = poVar7[uVar52].x1 + -4 < (int)local_124;
                      bVar56 = 1 < local_100;
                      plVar9 = *(long **)((long)poVar8 + uVar26 * 0x28);
                      if (plVar9 == (long *)0x0) {
                        bVar57 = false;
                      }
                      else {
                        OVar47 = *(OPJ_UINT32 *)((long)poVar8 + uVar26 * 0x28 + 0x14);
                        bp = (OPJ_BYTE *)
                             ((ulong)*(uint *)((long)poVar8 + uVar26 * 0x28 + 8) + *plVar9);
                        if ((bVar58 || bVar56) || bVar12) {
                          OVar15 = opj_mqc_init_dec(mqc,bp,OVar47);
                          if (OVar15 == 0) {
                            bVar57 = true;
                            goto LAB_00121bae;
                          }
                        }
                        else {
                          opj_raw_init_dec(raw,bp,OVar47);
                        }
                        bVar57 = false;
                        if ((*(int *)((long)poVar8 + uVar26 * 0x28 + 0x10) != 0) &&
                           (bVar57 = false, 0 < (int)local_124)) {
                          local_d4 = 0;
                          do {
                            bVar53 = (byte)local_124;
                            if (local_100 == 2) {
                              uVar22 = (1 << (bVar53 & 0x1f)) >> 1 | 1 << (local_124 & 0x1f);
                              poVar10 = t1->mqc;
                              if ((uVar4 & 8) == 0) {
                                local_168 = t1->data;
                                local_150 = (OPJ_INT32 *)(t1->flags + 1);
                                uVar54 = 0;
                                if (3 < t1->h) {
                                  uVar54 = 0;
                                  do {
                                    uVar37 = t1->w;
                                    if (uVar37 != 0) {
                                      local_148._0_4_ = uVar54 | 1;
                                      local_140 = uVar54 | 2;
                                      local_130._0_4_ = uVar54 | 3;
                                      uVar49 = 0;
                                      do {
                                        pOVar33 = local_168 + uVar49;
                                        poVar51 = t1->flags;
                                        uVar37 = t1->flags_stride;
                                        uVar25 = uVar49 + 1;
                                        iVar42 = (int)uVar25;
                                        if (((poVar51[uVar37 * local_140 + iVar42] |
                                              poVar51[uVar37 * (uint)local_148 + iVar42] |
                                              poVar51[uVar37 * (uint)local_130 + iVar42] |
                                             poVar51[uVar37 * (uVar54 + 4) + iVar42]) & 0x50ffU) ==
                                            0) {
                                          poVar10->curctx = poVar10->ctxs + 0x11;
                                          OVar17 = opj_mqc_decode(poVar10);
                                          if (OVar17 != 0) {
                                            poVar10->curctx = poVar10->ctxs + 0x12;
                                            OVar17 = opj_mqc_decode(poVar10);
                                            uVar37 = opj_mqc_decode(poVar10);
                                            uVar37 = uVar37 | OVar17 * 2;
                                            if (uVar37 < 4) {
                                              puVar50 = (uint *)(pOVar33 + t1->w * uVar37);
                                              puVar35 = (ushort *)
                                                        ((long)local_150 +
                                                        (uVar49 + t1->flags_stride * uVar37) * 2);
                                              iVar42 = 0;
                                              do {
                                                if (t1->h <= uVar37 + iVar42) break;
                                                puVar35 = puVar35 + t1->flags_stride;
                                                if (iVar42 == 0) {
                                                  poVar11 = t1->mqc;
                                                  uVar34 = *puVar35 >> 4 & 0xff;
                                                  poVar11->curctx =
                                                       poVar11->ctxs +
                                                                                                              
                                                  "\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r"
                                                  [uVar34];
                                                  uVar31 = opj_mqc_decode(poVar11);
                                                  bVar53 = ""[uVar34];
                                                  uVar34 = -uVar22;
                                                  if (uVar31 == bVar53) {
                                                    uVar34 = uVar22;
                                                  }
                                                  *puVar50 = uVar34;
                                                  opj_t1_updateflags((opj_flag_t *)puVar35,
                                                                     uVar31 ^ bVar53,
                                                                     t1->flags_stride);
                                                  *(byte *)((long)puVar35 + 1) =
                                                       *(byte *)((long)puVar35 + 1) & 0xbf;
                                                }
                                                else {
                                                  opj_t1_dec_clnpass_step
                                                            (t1,(opj_flag_t *)puVar35,
                                                             (OPJ_INT32 *)puVar50,OVar3,uVar22);
                                                }
                                                puVar50 = puVar50 + t1->w;
                                                iVar19 = uVar37 + iVar42;
                                                iVar42 = iVar42 + 1;
                                              } while (iVar19 != 3);
                                            }
                                          }
                                        }
                                        else {
                                          poVar51 = (opj_flag_t *)
                                                    ((long)local_150 + (uVar49 + uVar37) * 2);
                                          opj_t1_dec_clnpass_step(t1,poVar51,pOVar33,OVar3,uVar22);
                                          pOVar33 = pOVar33 + t1->w;
                                          poVar51 = poVar51 + t1->flags_stride;
                                          opj_t1_dec_clnpass_step(t1,poVar51,pOVar33,OVar3,uVar22);
                                          uVar37 = t1->w;
                                          uVar34 = t1->flags_stride;
                                          opj_t1_dec_clnpass_step
                                                    (t1,poVar51 + uVar34,pOVar33 + uVar37,OVar3,
                                                     uVar22);
                                          opj_t1_dec_clnpass_step
                                                    (t1,poVar51 + uVar34 + t1->flags_stride,
                                                     pOVar33 + uVar37 + t1->w,OVar3,uVar22);
                                        }
                                        uVar37 = t1->w;
                                        uVar49 = uVar25;
                                      } while (uVar25 < uVar37);
                                    }
                                    local_168 = local_168 + (uVar37 << 2);
                                    local_150 = (OPJ_INT32 *)
                                                ((long)local_150 +
                                                (ulong)(t1->flags_stride << 2) * 2);
                                    uVar54 = uVar54 + 4;
                                  } while (uVar54 < (t1->h & 0xfffffffc));
                                }
                                if (t1->w != 0) {
                                  uVar49 = 0;
                                  do {
                                    if (uVar54 < t1->h) {
                                      poVar51 = (opj_flag_t *)((long)local_150 + uVar49 * 2);
                                      pOVar33 = local_168 + uVar49;
                                      uVar37 = uVar54;
                                      do {
                                        poVar51 = poVar51 + t1->flags_stride;
                                        opj_t1_dec_clnpass_step(t1,poVar51,pOVar33,OVar3,uVar22);
                                        pOVar33 = pOVar33 + t1->w;
                                        uVar37 = uVar37 + 1;
                                      } while (uVar37 < t1->h);
                                    }
                                    uVar49 = uVar49 + 1;
                                  } while (uVar49 < t1->w);
                                }
                              }
                              else if (t1->h != 0) {
                                uVar54 = 0;
                                do {
                                  if (t1->w != 0) {
                                    local_e8 = uVar54 | 3;
                                    local_f8 = uVar54 | 1;
                                    uVar37 = 0;
                                    do {
                                      bVar57 = true;
                                      if (local_e8 < t1->h) {
                                        poVar51 = t1->flags;
                                        OVar47 = t1->flags_stride;
                                        if ((((poVar51[OVar47 * local_f8 + uVar37 + 1] & 0x50ffU) ==
                                              0) && (iVar42 = uVar37 + 1,
                                                    (poVar51[OVar47 * (uVar54 | 2) + iVar42] &
                                                    0x50ffU) == 0)) &&
                                           ((poVar51[OVar47 * local_e8 + iVar42] & 0x50ffU) == 0)) {
                                          bVar57 = (poVar51[OVar47 * (uVar54 + 4) + iVar42] &
                                                   0x50b9U) != 0;
                                        }
                                      }
                                      uVar34 = 0;
                                      if (bVar57) {
LAB_0012148a:
                                        if (uVar34 + uVar54 < uVar54 + 4) {
                                          iVar42 = 0;
                                          uVar31 = uVar34 + uVar54;
                                          do {
                                            if (t1->h <= uVar31) break;
                                            OVar47 = t1->w;
                                            puVar35 = (ushort *)
                                                      (t1->flags +
                                                      (t1->flags_stride * (uVar31 + 1) + uVar37 + 1)
                                                      );
                                            uVar39 = *puVar35 & 0xfbb9;
                                            uVar29 = *puVar35;
                                            if (uVar31 == t1->h - 1) {
                                              uVar29 = uVar39;
                                            }
                                            poVar11 = t1->mqc;
                                            pOVar33 = t1->data;
                                            if (uVar34 - 3 == iVar42) {
                                              uVar29 = uVar39;
                                            }
                                            if ((bool)(~bVar57 & iVar42 == 0)) {
LAB_00121579:
                                              uVar48 = uVar29 >> 4 & 0xff;
                                              poVar11->curctx =
                                                   poVar11->ctxs +
                                                                                                      
                                                  "\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r"
                                                  [uVar48];
                                              uVar36 = opj_mqc_decode(poVar11);
                                              bVar53 = ""[uVar48];
                                              uVar48 = -uVar22;
                                              if (uVar36 == bVar53) {
                                                uVar48 = uVar22;
                                              }
                                              pOVar33[OVar47 * uVar31 + uVar37] = uVar48;
                                              opj_t1_updateflags((opj_flag_t *)puVar35,
                                                                 uVar36 ^ bVar53,t1->flags_stride);
                                            }
                                            else if ((uVar29 & 0x5000) == 0) {
                                              poVar11->curctx =
                                                   poVar11->ctxs + ""[uVar29 & 0xff | uVar16];
                                              OVar17 = opj_mqc_decode(poVar11);
                                              if (OVar17 != 0) goto LAB_00121579;
                                            }
                                            *(byte *)((long)puVar35 + 1) =
                                                 *(byte *)((long)puVar35 + 1) & 0xbf;
                                            iVar42 = iVar42 + -1;
                                            uVar31 = uVar31 + 1;
                                          } while (uVar34 - 4 != iVar42);
                                        }
                                      }
                                      else {
                                        poVar10->curctx = poVar10->ctxs + 0x11;
                                        OVar17 = opj_mqc_decode(poVar10);
                                        if (OVar17 != 0) {
                                          poVar10->curctx = poVar10->ctxs + 0x12;
                                          OVar17 = opj_mqc_decode(poVar10);
                                          uVar34 = opj_mqc_decode(poVar10);
                                          uVar34 = uVar34 | OVar17 * 2;
                                          goto LAB_0012148a;
                                        }
                                      }
                                      uVar37 = uVar37 + 1;
                                    } while (uVar37 < t1->w);
                                  }
                                  uVar54 = uVar54 + 4;
                                } while (uVar54 < t1->h);
                              }
                              if ((uVar4 & 0x20) != 0) {
                                poVar10->curctx = poVar10->ctxs + 0x12;
                                opj_mqc_decode(poVar10);
                                opj_mqc_decode(poVar10);
                                opj_mqc_decode(poVar10);
                                opj_mqc_decode(poVar10);
                              }
                            }
                            else if (local_100 == 1) {
                              if ((bVar58 || bVar56) || bVar12) {
                                if ((uVar4 & 8) == 0) {
                                  local_150 = t1->data;
                                  poVar51 = t1->flags + 1;
                                  iVar42 = (1 << (bVar53 & 0x1f)) >> 1;
                                  iVar19 = -iVar42;
                                  uVar22 = 0;
                                  if (3 < t1->h) {
                                    uVar22 = 0;
                                    do {
                                      uVar54 = t1->w;
                                      if (uVar54 != 0) {
                                        uVar49 = 0;
                                        do {
                                          uVar25 = (ulong)t1->flags_stride;
                                          uVar29 = poVar51[uVar25 + uVar49];
                                          if ((uVar29 & 0x5000) == 0x1000) {
                                            poVar10 = t1->mqc;
                                            uVar54 = 0xf - ((char)uVar29 == '\0');
                                            if ((uVar29 >> 0xd & 1) != 0) {
                                              uVar54 = 0x10;
                                            }
                                            poVar10->curctx = poVar10->ctxs + uVar54;
                                            OVar17 = opj_mqc_decode(poVar10);
                                            iVar23 = iVar42;
                                            if (OVar17 == 0) {
                                              iVar23 = iVar19;
                                            }
                                            iVar30 = -iVar23;
                                            if (-1 < local_150[uVar49]) {
                                              iVar30 = iVar23;
                                            }
                                            local_150[uVar49] = iVar30 + local_150[uVar49];
                                            pbVar2 = (byte *)((long)poVar51 +
                                                             uVar49 * 2 + uVar25 * 2 + 1);
                                            *pbVar2 = *pbVar2 | 0x20;
                                          }
                                          uVar55 = (ulong)t1->w;
                                          uVar46 = (ulong)t1->flags_stride;
                                          lVar43 = uVar46 * 2 + uVar25 * 2;
                                          uVar29 = poVar51[uVar25 + uVar46 + uVar49];
                                          if ((uVar29 & 0x5000) == 0x1000) {
                                            poVar10 = t1->mqc;
                                            uVar54 = 0xf - ((char)uVar29 == '\0');
                                            if ((uVar29 >> 0xd & 1) != 0) {
                                              uVar54 = 0x10;
                                            }
                                            poVar10->curctx = poVar10->ctxs + uVar54;
                                            OVar17 = opj_mqc_decode(poVar10);
                                            iVar23 = iVar42;
                                            if (OVar17 == 0) {
                                              iVar23 = iVar19;
                                            }
                                            iVar30 = -iVar23;
                                            if (-1 < local_150[uVar55 + uVar49]) {
                                              iVar30 = iVar23;
                                            }
                                            local_150[uVar55 + uVar49] =
                                                 iVar30 + local_150[uVar55 + uVar49];
                                            pbVar2 = (byte *)((long)poVar51 +
                                                             uVar49 * 2 + lVar43 + 1);
                                            *pbVar2 = *pbVar2 | 0x20;
                                          }
                                          uVar20 = (ulong)t1->w;
                                          uVar24 = (ulong)t1->flags_stride;
                                          lVar43 = lVar43 + uVar24 * 2;
                                          uVar29 = poVar51[uVar24 + uVar25 + uVar46 + uVar49];
                                          if ((uVar29 & 0x5000) == 0x1000) {
                                            poVar10 = t1->mqc;
                                            uVar54 = 0xf - ((char)uVar29 == '\0');
                                            if ((uVar29 >> 0xd & 1) != 0) {
                                              uVar54 = 0x10;
                                            }
                                            poVar10->curctx = poVar10->ctxs + uVar54;
                                            OVar17 = opj_mqc_decode(poVar10);
                                            iVar23 = iVar42;
                                            if (OVar17 == 0) {
                                              iVar23 = iVar19;
                                            }
                                            iVar30 = -iVar23;
                                            if (-1 < local_150[uVar55 + uVar20 + uVar49]) {
                                              iVar30 = iVar23;
                                            }
                                            local_150[uVar55 + uVar20 + uVar49] =
                                                 iVar30 + local_150[uVar55 + uVar20 + uVar49];
                                            pbVar2 = (byte *)((long)poVar51 +
                                                             uVar49 * 2 + lVar43 + 1);
                                            *pbVar2 = *pbVar2 | 0x20;
                                          }
                                          uVar54 = t1->flags_stride;
                                          uVar29 = poVar51[(ulong)uVar54 +
                                                           uVar24 + uVar25 + uVar46 + uVar49];
                                          if ((uVar29 & 0x5000) == 0x1000) {
                                            uVar37 = t1->w;
                                            poVar10 = t1->mqc;
                                            uVar34 = 0xf - ((char)uVar29 == '\0');
                                            if ((uVar29 >> 0xd & 1) != 0) {
                                              uVar34 = 0x10;
                                            }
                                            poVar10->curctx = poVar10->ctxs + uVar34;
                                            OVar17 = opj_mqc_decode(poVar10);
                                            iVar23 = iVar42;
                                            if (OVar17 == 0) {
                                              iVar23 = iVar19;
                                            }
                                            iVar30 = -iVar23;
                                            if (-1 < local_150[(ulong)uVar37 +
                                                               uVar55 + uVar20 + uVar49]) {
                                              iVar30 = iVar23;
                                            }
                                            local_150[(ulong)uVar37 + uVar55 + uVar20 + uVar49] =
                                                 iVar30 + local_150[(ulong)uVar37 +
                                                                    uVar55 + uVar20 + uVar49];
                                            pbVar2 = (byte *)((long)poVar51 +
                                                             uVar49 * 2 +
                                                             lVar43 + (ulong)uVar54 * 2 + 1);
                                            *pbVar2 = *pbVar2 | 0x20;
                                          }
                                          uVar49 = uVar49 + 1;
                                          uVar54 = t1->w;
                                        } while (uVar49 < uVar54);
                                      }
                                      local_150 = local_150 + (uVar54 << 2);
                                      poVar51 = poVar51 + (t1->flags_stride << 2);
                                      uVar22 = uVar22 + 4;
                                    } while (uVar22 < (t1->h & 0xfffffffc));
                                  }
                                  if (t1->w != 0) {
                                    uVar49 = 0;
                                    do {
                                      if (uVar22 < t1->h) {
                                        puVar35 = (ushort *)(poVar51 + uVar49);
                                        piVar38 = local_150 + uVar49;
                                        uVar54 = uVar22;
                                        do {
                                          puVar35 = puVar35 + t1->flags_stride;
                                          uVar29 = *puVar35;
                                          if ((uVar29 & 0x5000) == 0x1000) {
                                            poVar10 = t1->mqc;
                                            uVar37 = 0xf - ((char)uVar29 == '\0');
                                            if ((uVar29 >> 0xd & 1) != 0) {
                                              uVar37 = 0x10;
                                            }
                                            poVar10->curctx = poVar10->ctxs + uVar37;
                                            OVar17 = opj_mqc_decode(poVar10);
                                            iVar23 = iVar42;
                                            if (OVar17 == 0) {
                                              iVar23 = iVar19;
                                            }
                                            iVar30 = -iVar23;
                                            if (-1 < *piVar38) {
                                              iVar30 = iVar23;
                                            }
                                            *piVar38 = iVar30 + *piVar38;
                                            *(byte *)((long)puVar35 + 1) =
                                                 *(byte *)((long)puVar35 + 1) | 0x20;
                                          }
                                          piVar38 = piVar38 + t1->w;
                                          uVar54 = uVar54 + 1;
                                        } while (uVar54 < t1->h);
                                      }
                                      uVar49 = uVar49 + 1;
                                    } while (uVar49 < t1->w);
                                  }
                                }
                                else if (t1->h != 0) {
                                  iVar42 = (1 << (bVar53 & 0x1f)) >> 1;
                                  uVar22 = 0;
                                  do {
                                    if (t1->w != 0) {
                                      uVar54 = 0;
                                      do {
                                        if (uVar22 != 0xfffffffc) {
                                          iVar19 = 3;
                                          uVar37 = uVar22;
                                          do {
                                            if (t1->h <= uVar37) break;
                                            poVar51 = t1->flags;
                                            uVar48 = uVar37 + 1;
                                            uVar49 = (ulong)(t1->flags_stride * uVar48 + uVar54 + 1)
                                            ;
                                            uVar34 = (uint)(ushort)poVar51[uVar49];
                                            uVar31 = uVar34 & 0xfffffbb9;
                                            if (uVar37 == t1->h - 1) {
                                              uVar34 = uVar31;
                                            }
                                            bVar57 = iVar19 == 0;
                                            iVar19 = iVar19 + -1;
                                            if (bVar57) {
                                              uVar34 = uVar31;
                                            }
                                            if ((uVar34 & 0x5000) == 0x1000) {
                                              poVar10 = t1->mqc;
                                              pOVar33 = t1->data;
                                              uVar31 = uVar37 * t1->w + uVar54;
                                              uVar37 = 0xf - ((char)uVar34 == '\0');
                                              if ((uVar34 >> 0xd & 1) != 0) {
                                                uVar37 = 0x10;
                                              }
                                              poVar10->curctx = poVar10->ctxs + uVar37;
                                              OVar17 = opj_mqc_decode(poVar10);
                                              iVar23 = iVar42;
                                              if (OVar17 == 0) {
                                                iVar23 = -iVar42;
                                              }
                                              iVar30 = pOVar33[uVar31];
                                              iVar32 = -iVar23;
                                              if (-1 < iVar30) {
                                                iVar32 = iVar23;
                                              }
                                              pOVar33[uVar31] = iVar32 + iVar30;
                                              pbVar2 = (byte *)((long)poVar51 + uVar49 * 2 + 1);
                                              *pbVar2 = *pbVar2 | 0x20;
                                            }
                                            uVar37 = uVar48;
                                          } while (uVar48 < uVar22 + 4);
                                        }
                                        uVar54 = uVar54 + 1;
                                      } while (uVar54 < t1->w);
                                    }
                                    uVar22 = uVar22 + 4;
                                  } while (uVar22 < t1->h);
                                }
                              }
                              else if (t1->h != 0) {
                                iVar42 = (1 << (bVar53 & 0x1f)) >> 1;
                                uVar22 = 0;
                                do {
                                  if (t1->w != 0) {
                                    uVar54 = 0;
                                    do {
                                      if (uVar22 != 0xfffffffc) {
                                        uVar37 = uVar22;
                                        do {
                                          if (t1->h <= uVar37) break;
                                          poVar51 = t1->flags;
                                          uVar34 = uVar37 + 1;
                                          uVar49 = (ulong)(t1->flags_stride * uVar34 + uVar54 + 1);
                                          if ((poVar51[uVar49] & 0x5000U) == 0x1000) {
                                            pOVar33 = t1->data;
                                            uVar37 = uVar37 * t1->w + uVar54;
                                            OVar47 = opj_raw_decode(t1->raw);
                                            iVar19 = iVar42;
                                            if (OVar47 == 0) {
                                              iVar19 = -iVar42;
                                            }
                                            iVar23 = pOVar33[uVar37];
                                            iVar30 = -iVar19;
                                            if (-1 < iVar23) {
                                              iVar30 = iVar19;
                                            }
                                            pOVar33[uVar37] = iVar30 + iVar23;
                                            pbVar2 = (byte *)((long)poVar51 + uVar49 * 2 + 1);
                                            *pbVar2 = *pbVar2 | 0x20;
                                          }
                                          uVar37 = uVar34;
                                        } while (uVar34 < uVar22 + 4);
                                      }
                                      uVar54 = uVar54 + 1;
                                    } while (uVar54 < t1->w);
                                  }
                                  uVar22 = uVar22 + 4;
                                } while (uVar22 < t1->h);
                              }
                            }
                            else if ((bVar58 || bVar56) || bVar12) {
                              if ((uVar4 & 8) == 0) {
                                local_130 = t1->data;
                                local_160 = t1->flags + 1;
                                uVar54 = (1 << (bVar53 & 0x1f)) >> 1 | 1 << (local_124 & 0x1f);
                                uVar22 = 0;
                                uVar49 = (ulong)uVar16;
                                if (3 < t1->h) {
                                  uVar37 = -uVar54;
                                  uVar22 = 0;
                                  do {
                                    uVar34 = t1->w;
                                    if (uVar34 != 0) {
                                      lVar43 = 0;
                                      uVar25 = 0;
                                      do {
                                        uVar46 = (ulong)t1->flags_stride;
                                        uVar29 = *(ushort *)((long)local_160 + lVar43 + uVar46 * 2);
                                        if ((uVar29 & 0x5000) == 0 && (uVar29 & 0xff) != 0) {
                                          poVar10 = t1->mqc;
                                          poVar10->curctx =
                                               poVar10->ctxs + ""[(ulong)uVar29 & 0xff | uVar49];
                                          OVar17 = opj_mqc_decode(poVar10);
                                          if (OVar17 != 0) {
                                            bVar53 = (byte)(uVar29 >> 4);
                                            poVar10->curctx =
                                                 poVar10->ctxs +
                                                 "\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r"
                                                 [bVar53];
                                            uVar31 = opj_mqc_decode(poVar10);
                                            bVar53 = ""[bVar53];
                                            uVar34 = uVar37;
                                            if (uVar31 == bVar53) {
                                              uVar34 = uVar54;
                                            }
                                            *(uint *)((long)local_130 + lVar43 * 2) = uVar34;
                                            opj_t1_updateflags((opj_flag_t *)
                                                               (uVar46 * 2 + lVar43 +
                                                               (long)local_160),uVar31 ^ bVar53,
                                                               t1->flags_stride);
                                          }
                                          pbVar2 = (byte *)((long)local_160 +
                                                           lVar43 + uVar46 * 2 + 1);
                                          *pbVar2 = *pbVar2 | 0x40;
                                        }
                                        uVar34 = t1->w;
                                        lVar44 = (ulong)t1->flags_stride * 2 + uVar46 * 2;
                                        uVar29 = *(ushort *)((long)local_160 + lVar43 + lVar44);
                                        if ((uVar29 & 0x5000) == 0 && (uVar29 & 0xff) != 0) {
                                          poVar10 = t1->mqc;
                                          poVar10->curctx =
                                               poVar10->ctxs + ""[(ulong)uVar29 & 0xff | uVar49];
                                          OVar17 = opj_mqc_decode(poVar10);
                                          if (OVar17 != 0) {
                                            bVar53 = (byte)(uVar29 >> 4);
                                            poVar10->curctx =
                                                 poVar10->ctxs +
                                                 "\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r"
                                                 [bVar53];
                                            uVar48 = opj_mqc_decode(poVar10);
                                            bVar53 = ""[bVar53];
                                            uVar31 = uVar37;
                                            if (uVar48 == bVar53) {
                                              uVar31 = uVar54;
                                            }
                                            *(uint *)((long)local_130 +
                                                     lVar43 * 2 + (ulong)uVar34 * 4) = uVar31;
                                            opj_t1_updateflags((opj_flag_t *)
                                                               ((long)local_160 + lVar44 + lVar43),
                                                               uVar48 ^ bVar53,t1->flags_stride);
                                          }
                                          pbVar2 = (byte *)((long)local_160 + lVar43 + lVar44 + 1);
                                          *pbVar2 = *pbVar2 | 0x40;
                                        }
                                        lVar1 = (ulong)t1->w * 4 + (ulong)uVar34 * 4;
                                        lVar44 = lVar44 + (ulong)t1->flags_stride * 2;
                                        uVar29 = *(ushort *)((long)local_160 + lVar43 + lVar44);
                                        if ((uVar29 & 0x5000) == 0 && (uVar29 & 0xff) != 0) {
                                          poVar10 = t1->mqc;
                                          poVar10->curctx =
                                               poVar10->ctxs + ""[(ulong)uVar29 & 0xff | uVar49];
                                          OVar17 = opj_mqc_decode(poVar10);
                                          if (OVar17 != 0) {
                                            bVar53 = (byte)(uVar29 >> 4);
                                            poVar10->curctx =
                                                 poVar10->ctxs +
                                                 "\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r"
                                                 [bVar53];
                                            uVar31 = opj_mqc_decode(poVar10);
                                            bVar53 = ""[bVar53];
                                            uVar34 = uVar37;
                                            if (uVar31 == bVar53) {
                                              uVar34 = uVar54;
                                            }
                                            *(uint *)((long)local_130 + lVar43 * 2 + lVar1) = uVar34
                                            ;
                                            opj_t1_updateflags((opj_flag_t *)
                                                               ((long)local_160 + lVar44 + lVar43),
                                                               uVar31 ^ bVar53,t1->flags_stride);
                                          }
                                          pbVar2 = (byte *)((long)local_160 + lVar43 + lVar44 + 1);
                                          *pbVar2 = *pbVar2 | 0x40;
                                        }
                                        lVar44 = lVar44 + (ulong)t1->flags_stride * 2;
                                        uVar29 = *(ushort *)((long)local_160 + lVar43 + lVar44);
                                        if ((uVar29 & 0x5000) == 0 && (uVar29 & 0xff) != 0) {
                                          uVar34 = t1->w;
                                          poVar10 = t1->mqc;
                                          poVar10->curctx =
                                               poVar10->ctxs + ""[(ulong)uVar29 & 0xff | uVar49];
                                          OVar17 = opj_mqc_decode(poVar10);
                                          if (OVar17 != 0) {
                                            bVar53 = (byte)(uVar29 >> 4);
                                            poVar10->curctx =
                                                 poVar10->ctxs +
                                                 "\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r"
                                                 [bVar53];
                                            uVar48 = opj_mqc_decode(poVar10);
                                            bVar53 = ""[bVar53];
                                            uVar31 = uVar37;
                                            if (uVar48 == bVar53) {
                                              uVar31 = uVar54;
                                            }
                                            *(uint *)((long)local_130 +
                                                     lVar43 * 2 + lVar1 + (ulong)uVar34 * 4) =
                                                 uVar31;
                                            opj_t1_updateflags((opj_flag_t *)
                                                               ((long)local_160 + lVar44 + lVar43),
                                                               uVar48 ^ bVar53,t1->flags_stride);
                                          }
                                          pbVar2 = (byte *)((long)local_160 + lVar43 + lVar44 + 1);
                                          *pbVar2 = *pbVar2 | 0x40;
                                        }
                                        uVar25 = uVar25 + 1;
                                        uVar34 = t1->w;
                                        lVar43 = lVar43 + 2;
                                      } while (uVar25 < uVar34);
                                    }
                                    local_130 = local_130 + (uVar34 << 2);
                                    local_160 = local_160 + (t1->flags_stride << 2);
                                    uVar22 = uVar22 + 4;
                                  } while (uVar22 < (t1->h & 0xfffffffc));
                                }
                                if (t1->w != 0) {
                                  local_148 = 0;
                                  do {
                                    if (uVar22 < t1->h) {
                                      puVar35 = (ushort *)(local_160 + local_148);
                                      puVar50 = (uint *)(local_130 + local_148);
                                      uVar37 = uVar22;
                                      do {
                                        puVar35 = puVar35 + t1->flags_stride;
                                        uVar29 = *puVar35;
                                        if ((uVar29 & 0x5000) == 0 && (uVar29 & 0xff) != 0) {
                                          poVar10 = t1->mqc;
                                          poVar10->curctx =
                                               poVar10->ctxs + ""[(ulong)uVar29 & 0xff | uVar49];
                                          OVar17 = opj_mqc_decode(poVar10);
                                          if (OVar17 != 0) {
                                            bVar53 = (byte)(uVar29 >> 4);
                                            poVar10->curctx =
                                                 poVar10->ctxs +
                                                 "\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r"
                                                 [bVar53];
                                            uVar31 = opj_mqc_decode(poVar10);
                                            bVar53 = ""[bVar53];
                                            uVar34 = -uVar54;
                                            if (uVar31 == bVar53) {
                                              uVar34 = uVar54;
                                            }
                                            *puVar50 = uVar34;
                                            opj_t1_updateflags((opj_flag_t *)puVar35,uVar31 ^ bVar53
                                                               ,t1->flags_stride);
                                          }
                                          *(byte *)((long)puVar35 + 1) =
                                               *(byte *)((long)puVar35 + 1) | 0x40;
                                        }
                                        puVar50 = puVar50 + t1->w;
                                        uVar37 = uVar37 + 1;
                                      } while (uVar37 < t1->h);
                                    }
                                    local_148 = local_148 + 1;
                                  } while (local_148 < t1->w);
                                }
                              }
                              else if (t1->h != 0) {
                                uVar54 = (1 << (bVar53 & 0x1f)) >> 1 | 1 << (local_124 & 0x1f);
                                uVar22 = 0;
                                do {
                                  if (t1->w != 0) {
                                    uVar37 = 0;
                                    do {
                                      if (uVar22 != 0xfffffffc) {
                                        iVar42 = 3;
                                        uVar34 = uVar22;
                                        do {
                                          if (t1->h <= uVar34) break;
                                          uVar36 = uVar34 + 1;
                                          uVar48 = t1->flags_stride * uVar36 + uVar37 + 1;
                                          uVar31 = (uint)(ushort)t1->flags[uVar48];
                                          uVar41 = uVar31 & 0xfffffbb9;
                                          if (uVar34 == t1->h - 1) {
                                            uVar31 = uVar41;
                                          }
                                          bVar57 = iVar42 == 0;
                                          iVar42 = iVar42 + -1;
                                          if (bVar57) {
                                            uVar31 = uVar41;
                                          }
                                          if ((uVar31 & 0x5000) == 0 && (uVar31 & 0xff) != 0) {
                                            OVar47 = t1->w;
                                            poVar51 = t1->flags + uVar48;
                                            poVar10 = t1->mqc;
                                            pOVar33 = t1->data;
                                            poVar10->curctx =
                                                 poVar10->ctxs + ""[uVar31 & 0xff | uVar16];
                                            OVar17 = opj_mqc_decode(poVar10);
                                            if (OVar17 != 0) {
                                              uVar31 = uVar31 >> 4 & 0xff;
                                              poVar10->curctx =
                                                   poVar10->ctxs +
                                                                                                      
                                                  "\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r"
                                                  [uVar31];
                                              uVar48 = opj_mqc_decode(poVar10);
                                              bVar53 = ""[uVar31];
                                              uVar31 = -uVar54;
                                              if (uVar48 == bVar53) {
                                                uVar31 = uVar54;
                                              }
                                              pOVar33[uVar34 * OVar47 + uVar37] = uVar31;
                                              opj_t1_updateflags(poVar51,uVar48 ^ bVar53,
                                                                 t1->flags_stride);
                                            }
                                            pbVar2 = (byte *)((long)poVar51 + 1);
                                            *pbVar2 = *pbVar2 | 0x40;
                                          }
                                          uVar34 = uVar36;
                                        } while (uVar36 < uVar22 + 4);
                                      }
                                      uVar37 = uVar37 + 1;
                                    } while (uVar37 < t1->w);
                                  }
                                  uVar22 = uVar22 + 4;
                                } while (uVar22 < t1->h);
                              }
                            }
                            else if (t1->h != 0) {
                              uVar54 = (1 << (bVar53 & 0x1f)) >> 1 | 1 << (local_124 & 0x1f);
                              uVar22 = 0;
                              do {
                                if (t1->w != 0) {
                                  uVar37 = 0;
                                  do {
                                    if (uVar22 != 0xfffffffc) {
                                      iVar42 = 3;
                                      uVar34 = uVar22;
                                      do {
                                        if (t1->h <= uVar34) break;
                                        bVar57 = true;
                                        if ((uVar4 & 8) != 0) {
                                          if (iVar42 == 0) {
                                            bVar57 = false;
                                          }
                                          else {
                                            bVar57 = uVar34 != t1->h - 1;
                                          }
                                        }
                                        uVar48 = uVar34 + 1;
                                        uVar31 = t1->flags_stride * uVar48 + uVar37 + 1;
                                        uVar29 = t1->flags[uVar31];
                                        uVar39 = uVar29 & 0xfbb9;
                                        if (bVar57) {
                                          uVar39 = uVar29;
                                        }
                                        if ((uVar39 & 0x5000) == 0 && (char)uVar39 != '\0') {
                                          poVar51 = t1->flags + uVar31;
                                          raw_00 = t1->raw;
                                          pOVar33 = t1->data;
                                          OVar47 = t1->w;
                                          OVar18 = opj_raw_decode(raw_00);
                                          if (OVar18 != 0) {
                                            OVar18 = opj_raw_decode(raw_00);
                                            uVar31 = -uVar54;
                                            if (OVar18 == 0) {
                                              uVar31 = uVar54;
                                            }
                                            pOVar33[uVar34 * OVar47 + uVar37] = uVar31;
                                            opj_t1_updateflags(poVar51,OVar18,t1->flags_stride);
                                          }
                                          pbVar2 = (byte *)((long)poVar51 + 1);
                                          *pbVar2 = *pbVar2 | 0x40;
                                        }
                                        iVar42 = iVar42 + -1;
                                        uVar34 = uVar48;
                                      } while (uVar48 < uVar22 + 4);
                                    }
                                    uVar37 = uVar37 + 1;
                                  } while (uVar37 < t1->w);
                                }
                                uVar22 = uVar22 + 4;
                              } while (uVar22 < t1->h);
                            }
                            if (((byte)uVar4 >> 1 & ((bVar58 || bVar56) || bVar12)) != 0) {
                              opj_mqc_resetstates(mqc);
                              opj_mqc_setstate(mqc,0x12,0,0x2e);
                              opj_mqc_setstate(mqc,0x11,0,3);
                              opj_mqc_setstate(mqc,0,0,4);
                            }
                            local_100 = local_100 + 1;
                            bVar57 = false;
                            bVar59 = local_100 == 3;
                            if (bVar59) {
                              local_100 = 0;
                            }
                            local_124 = local_124 - bVar59;
                            local_d4 = local_d4 + 1;
                          } while ((local_d4 < *(uint *)((long)poVar8 + uVar26 * 0x28 + 0x10)) &&
                                  (0 < (int)local_124));
                        }
                      }
LAB_00121bae:
                      if (bVar57) {
                        return 0;
                      }
                      uVar26 = uVar26 + 1;
                    } while (uVar26 < poVar7[uVar52].numpassesinlayers);
                  }
                  iVar42 = *(int *)&poVar7[uVar52].passes - poVar45->x0;
                  if ((poVar45->bandno & 1) != 0) {
                    iVar42 = (iVar42 + tilec->resolutions[uVar14].x1) -
                             tilec->resolutions[uVar14].x0;
                  }
                  iVar19 = *(int *)((long)&poVar7[uVar52].passes + 4) - poVar45->y0;
                  if ((poVar45->bandno & 2) != 0) {
                    iVar19 = (iVar19 + tilec->resolutions[uVar14].y1) -
                             tilec->resolutions[uVar14].y0;
                  }
                  pOVar33 = t1->data;
                  uVar4 = t1->w;
                  uVar26 = (ulong)uVar4;
                  OVar3 = t1->h;
                  iVar23 = tccp->roishift;
                  if ((iVar23 != 0) && (OVar3 != 0)) {
                    uVar16 = 0;
                    OVar47 = 0;
                    uVar49 = uVar26;
                    uVar22 = uVar16;
                    do {
                      for (; uVar49 != 0; uVar49 = uVar49 - 1) {
                        uVar54 = pOVar33[uVar16];
                        uVar37 = -uVar54;
                        if (0 < (int)uVar54) {
                          uVar37 = uVar54;
                        }
                        if (1 << ((byte)iVar23 & 0x1f) <= (int)uVar37) {
                          uVar37 = uVar37 >> ((byte)tccp->roishift & 0x1f);
                          uVar34 = -uVar37;
                          if (-1 < (int)uVar54) {
                            uVar34 = uVar37;
                          }
                          pOVar33[uVar16] = uVar34;
                        }
                        uVar16 = uVar16 + 1;
                      }
                      OVar47 = OVar47 + 1;
                      uVar16 = uVar22 + uVar4;
                      uVar49 = uVar26;
                      uVar22 = uVar16;
                    } while (OVar47 != OVar3);
                  }
                  if (tccp->qmfbid == 1) {
                    if (OVar3 != 0) {
                      pOVar21 = tilec->data;
                      uVar49 = 0;
                      uVar25 = 0;
                      OVar47 = 0;
                      do {
                        iVar23 = (int)uVar49;
                        iVar30 = (int)uVar25;
                        for (uVar46 = uVar26; uVar46 != 0; uVar46 = uVar46 - 1) {
                          pOVar21[(iVar19 * uVar13 + iVar42) + uVar25] = pOVar33[uVar49] / 2;
                          uVar25 = (ulong)((int)uVar25 + 1);
                          uVar49 = (ulong)((int)uVar49 + 1);
                        }
                        OVar47 = OVar47 + 1;
                        uVar25 = (ulong)(iVar30 + uVar13);
                        uVar49 = (ulong)(iVar23 + uVar4);
                      } while (OVar47 != OVar3);
                    }
                  }
                  else if (OVar3 != 0) {
                    pOVar21 = tilec->data + (iVar19 * uVar13 + iVar42);
                    OVar47 = 0;
                    do {
                      if (uVar26 != 0) {
                        lVar43 = 0;
                        lVar44 = 0;
                        do {
                          pOVar21[lVar44] =
                               (OPJ_INT32)((float)pOVar33[lVar44] * (float)poVar45->stepsize);
                          lVar44 = lVar44 + 1;
                          lVar43 = lVar43 + -4;
                        } while (uVar4 != (uint)lVar44);
                        pOVar33 = (OPJ_INT32 *)((long)pOVar33 - lVar43);
                      }
                      OVar47 = OVar47 + 1;
                      pOVar21 = pOVar21 + uVar13;
                    } while (OVar47 != OVar3);
                  }
                  uVar52 = uVar52 + 1;
                } while (uVar52 < poVar6[uVar27].ch * poVar6[uVar27].cw);
              }
              uVar27 = uVar27 + 1;
            } while (uVar27 < poVar5[uVar28].ph * poVar5[uVar28].pw);
          }
          uVar40 = uVar40 + 1;
        } while (uVar40 < poVar5[uVar28].numbands);
      }
      uVar28 = uVar28 + 1;
    } while (uVar28 < tilec->minimum_num_resolutions);
  }
  return 1;
}

Assistant:

OPJ_BOOL opj_t1_decode_cblks(   opj_t1_t* t1,
                            opj_tcd_tilecomp_t* tilec,
                            opj_tccp_t* tccp
                            )
{
	OPJ_UINT32 resno, bandno, precno, cblkno;
	OPJ_UINT32 tile_w = (OPJ_UINT32)(tilec->x1 - tilec->x0);

	for (resno = 0; resno < tilec->minimum_num_resolutions; ++resno) {
		opj_tcd_resolution_t* res = &tilec->resolutions[resno];

		for (bandno = 0; bandno < res->numbands; ++bandno) {
			opj_tcd_band_t* OPJ_RESTRICT band = &res->bands[bandno];

			for (precno = 0; precno < res->pw * res->ph; ++precno) {
				opj_tcd_precinct_t* precinct = &band->precincts[precno];

				for (cblkno = 0; cblkno < precinct->cw * precinct->ch; ++cblkno) {
					opj_tcd_cblk_dec_t* cblk = &precinct->cblks.dec[cblkno];
					OPJ_INT32* OPJ_RESTRICT datap;
					OPJ_UINT32 cblk_w, cblk_h;
					OPJ_INT32 x, y;
					OPJ_UINT32 i, j;

                    if (OPJ_FALSE == opj_t1_decode_cblk(
                                            t1,
                                            cblk,
                                            band->bandno,
                                            (OPJ_UINT32)tccp->roishift,
                                            tccp->cblksty)) {
                            return OPJ_FALSE;
                    }

					x = cblk->x0 - band->x0;
					y = cblk->y0 - band->y0;
					if (band->bandno & 1) {
						opj_tcd_resolution_t* pres = &tilec->resolutions[resno - 1];
						x += pres->x1 - pres->x0;
					}
					if (band->bandno & 2) {
						opj_tcd_resolution_t* pres = &tilec->resolutions[resno - 1];
						y += pres->y1 - pres->y0;
					}

					datap=t1->data;
					cblk_w = t1->w;
					cblk_h = t1->h;

					if (tccp->roishift) {
						OPJ_INT32 thresh = 1 << tccp->roishift;
						for (j = 0; j < cblk_h; ++j) {
							for (i = 0; i < cblk_w; ++i) {
								OPJ_INT32 val = datap[(j * cblk_w) + i];
								OPJ_INT32 mag = abs(val);
								if (mag >= thresh) {
									mag >>= tccp->roishift;
									datap[(j * cblk_w) + i] = val < 0 ? -mag : mag;
								}
							}
						}
					}
					if (tccp->qmfbid == 1) {
                        OPJ_INT32* OPJ_RESTRICT tiledp = &tilec->data[(OPJ_UINT32)y * tile_w + (OPJ_UINT32)x];
						for (j = 0; j < cblk_h; ++j) {
							for (i = 0; i < cblk_w; ++i) {
								OPJ_INT32 tmp = datap[(j * cblk_w) + i];
								((OPJ_INT32*)tiledp)[(j * tile_w) + i] = tmp/2;
							}
						}
					} else {		/* if (tccp->qmfbid == 0) */
                        OPJ_FLOAT32* OPJ_RESTRICT tiledp = (OPJ_FLOAT32*) &tilec->data[(OPJ_UINT32)y * tile_w + (OPJ_UINT32)x];
						for (j = 0; j < cblk_h; ++j) {
                            OPJ_FLOAT32* OPJ_RESTRICT tiledp2 = tiledp;
							for (i = 0; i < cblk_w; ++i) {
                                OPJ_FLOAT32 tmp = (OPJ_FLOAT32)*datap * band->stepsize;
                                *tiledp2 = tmp;
                                datap++;
                                tiledp2++;
							}
                            tiledp += tile_w;
						}
					}
				} /* cblkno */
			} /* precno */
		} /* bandno */
	} /* resno */
        return OPJ_TRUE;
}